

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  void *pvVar1;
  int local_38;
  undefined1 local_34 [4];
  int i;
  epoll_event dummy;
  uv__invalidate *inv;
  uv__loop_internal_fields_t *lfields;
  int fd_local;
  uv_loop_t *loop_local;
  
  pvVar1 = loop->internal_fields;
  dummy.data = *(epoll_data_t *)((long)pvVar1 + 0x1d8);
  if (dummy.data.ptr != (void *)0x0) {
    for (local_38 = 0; local_38 < *(int *)(dummy.data.u64 + 0x10); local_38 = local_38 + 1) {
      if (*(int *)(*(long *)(dummy.data.u64 + 8) + (long)local_38 * 0xc + 4) == fd) {
        *(undefined4 *)(*(long *)(dummy.data.u64 + 8) + (long)local_38 * 0xc + 4) = 0xffffffff;
      }
    }
  }
  memset(local_34,0,0xc);
  if (dummy.data.ptr == (void *)0x0) {
    epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)local_34);
  }
  else {
    uv__epoll_ctl_prep(loop->backend_fd,(uv__iou *)((long)pvVar1 + 200),*dummy.data.ptr,2,fd,
                       (epoll_event *)local_34);
  }
  return;
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  uv__loop_internal_fields_t* lfields;
  struct uv__invalidate* inv;
  struct epoll_event dummy;
  int i;

  lfields = uv__get_internal_fields(loop);
  inv = lfields->inv;

  /* Invalidate events with same file descriptor */
  if (inv != NULL)
    for (i = 0; i < inv->nfds; i++)
      if (inv->events[i].data.fd == fd)
        inv->events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   *
   * Work around a bug in kernels 3.10 to 3.19 where passing a struct that
   * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
   */
  memset(&dummy, 0, sizeof(dummy));

  if (inv == NULL) {
    epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
  } else {
    uv__epoll_ctl_prep(loop->backend_fd,
                       &lfields->ctl,
                       inv->prep,
                       EPOLL_CTL_DEL,
                       fd,
                       &dummy);
  }
}